

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_aggregator.cc
# Opt level: O1

void __thiscall StatAggregator::StatAggregator(StatAggregator *this,int _num_stats,int _num_samples)

{
  undefined1 auVar1 [16];
  StatMatrix_t ppsVar2;
  ulong *puVar3;
  ulong *puVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  this->num_stats = _num_stats;
  this->num_samples = _num_samples;
  uVar6 = (long)_num_stats * 8;
  if (_num_stats < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  ppsVar2 = (StatMatrix_t)operator_new__(uVar6);
  this->t_stats = ppsVar2;
  if (0 < _num_stats) {
    uVar8 = (ulong)_num_samples;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar8;
    uVar6 = SUB168(auVar1 * ZEXT816(0x38),0);
    uVar7 = uVar6 + 8;
    if (0xfffffffffffffff7 < uVar6) {
      uVar7 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(0x38),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    uVar6 = 0;
    do {
      puVar3 = (ulong *)operator_new__(uVar7);
      *puVar3 = uVar8;
      if (_num_samples != 0) {
        puVar4 = puVar3 + 3;
        lVar5 = uVar8 * 0x38;
        do {
          puVar4[-2] = (ulong)puVar4;
          puVar4[-1] = 0;
          *(undefined1 *)puVar4 = 0;
          puVar4[2] = 0;
          puVar4[3] = 0;
          puVar4[4] = 0;
          puVar4 = puVar4 + 7;
          lVar5 = lVar5 + -0x38;
        } while (lVar5 != 0);
      }
      this->t_stats[uVar6] = (stat_history_t *)(puVar3 + 1);
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)_num_stats);
  }
  return;
}

Assistant:

StatAggregator::StatAggregator(int _num_stats, int _num_samples) {

    num_stats = _num_stats;
    num_samples = _num_samples;
    t_stats = new stat_history_t*[num_stats];
    for (int i = 0; i < num_stats; ++i) {
        t_stats[i] = new stat_history_t[num_samples];
    }
}